

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O3

Elf_Half __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::add_section_index
          (segment_impl<ELFIO::Elf32_Phdr> *this,Elf_Half sec_index,Elf_Xword addr_align)

{
  iterator __position;
  int iVar1;
  undefined4 extraout_var;
  Elf_Half local_1a;
  Elf_Xword local_18;
  
  __position._M_current =
       (this->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a = sec_index;
  local_18 = addr_align;
  if (__position._M_current ==
      (this->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_realloc_insert<unsigned_short&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->sections,__position,
               &local_1a);
  }
  else {
    *__position._M_current = sec_index;
    (this->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar1 = (*(this->super_segment)._vptr_segment[7])(this);
  if (CONCAT44(extraout_var,iVar1) < addr_align) {
    (*(this->super_segment)._vptr_segment[8])(this,&local_18);
  }
  return (Elf_Half)
         ((uint)(*(int *)&(this->sections).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->sections).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 1);
}

Assistant:

Elf_Half add_section_index( Elf_Half  sec_index,
                                Elf_Xword addr_align ) override
    {
        sections.emplace_back( sec_index );
        if ( addr_align > get_align() ) {
            set_align( addr_align );
        }

        return (Elf_Half)sections.size();
    }